

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

cmSourceFile * __thiscall
cmQtAutoGenInitializer::RegisterGeneratedSource(cmQtAutoGenInitializer *this,string *filename)

{
  cmSourceFile *this_00;
  string local_38;
  
  this_00 = cmMakefile::GetOrCreateSource(this->Makefile,filename,true,Ambiguous);
  cmSourceFile::MarkAsGenerated(this_00);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"SKIP_AUTOGEN","");
  cmSourceFile::SetProperty(this_00,&local_38,"1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

cmSourceFile* cmQtAutoGenInitializer::RegisterGeneratedSource(
  std::string const& filename)
{
  cmSourceFile* gFile = this->Makefile->GetOrCreateSource(filename, true);
  gFile->MarkAsGenerated();
  gFile->SetProperty("SKIP_AUTOGEN", "1");
  return gFile;
}